

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

ColumnBinding duckdb::ColumnBinding::Deserialize(Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  _func_int **pp_Var4;
  idx_t iVar5;
  ColumnBinding CVar6;
  idx_t iVar3;
  undefined4 extraout_var_00;
  
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"table_index");
  pp_Var4 = deserializer->_vptr_Deserializer;
  if ((char)uVar1 == '\0') {
    iVar3 = 0;
  }
  else {
    iVar2 = (*pp_Var4[0x15])(deserializer);
    iVar3 = CONCAT44(extraout_var,iVar2);
    pp_Var4 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var4[5])(deserializer,(ulong)(uVar1 & 0xff));
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"column_index");
  if ((char)uVar1 == '\0') {
    iVar5 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar5 = CONCAT44(extraout_var_00,iVar2);
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  CVar6.column_index = iVar5;
  CVar6.table_index = iVar3;
  return CVar6;
}

Assistant:

ColumnBinding ColumnBinding::Deserialize(Deserializer &deserializer) {
	ColumnBinding result;
	deserializer.ReadPropertyWithDefault<idx_t>(100, "table_index", result.table_index);
	deserializer.ReadPropertyWithDefault<idx_t>(101, "column_index", result.column_index);
	return result;
}